

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gauss_pyramid.h
# Opt level: O3

void gimage::reduceGauss<unsigned_short,unsigned_short>
               (Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_> *target,
               Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_> *image)

{
  ushort uVar1;
  int iVar2;
  float **ppfVar3;
  float *pfVar4;
  long lVar5;
  long lVar6;
  unsigned_short ***pppuVar7;
  unsigned_short *puVar8;
  int iVar9;
  long lVar10;
  long lVar11;
  float *pfVar12;
  ushort *puVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  unsigned_short *puVar19;
  long lVar20;
  float fVar21;
  ImageFloat tmp;
  long local_d8;
  Image<float,_gimage::PixelTraits<float>_> local_68;
  
  local_68.depth = 0;
  local_68.width = 0;
  local_68.height = 0;
  local_68.n = 0;
  local_68.pixel = (float *)0x0;
  local_68.row = (float **)0x0;
  local_68.img = (float ***)0x0;
  Image<float,_gimage::PixelTraits<float>_>::setSize
            (&local_68,(image->width - (image->width + 1 >> 0x3f)) + 1 >> 1,image->height,1);
  Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_>::setSize
            (target,(image->width - (image->width + 1 >> 0x3f)) + 1 >> 1,
             (image->height - (image->height + 1 >> 0x3f)) + 1 >> 1,(long)image->depth);
  iVar2 = image->depth;
  if (0 < (long)iVar2) {
    ppfVar3 = *local_68.img;
    pfVar4 = *ppfVar3;
    lVar5 = image->width;
    lVar6 = image->height;
    pppuVar7 = target->img;
    local_d8 = 0;
    do {
      if (0 < lVar6) {
        lVar10 = 0;
        pfVar12 = pfVar4;
        do {
          if (0 < lVar5) {
            puVar8 = image->img[local_d8][lVar10];
            lVar11 = 0;
            do {
              if (lVar11 == 0 || lVar5 + -2 <= lVar11) {
                fVar21 = 0.0;
                lVar18 = 0;
                lVar17 = lVar11;
                do {
                  lVar14 = 2;
                  if (2 < lVar17) {
                    lVar14 = lVar17;
                  }
                  lVar20 = lVar14 + -2;
                  if (lVar5 + -1 <= lVar14 + -2) {
                    lVar20 = lVar5 + -1;
                  }
                  fVar21 = fVar21 + (float)puVar8[lVar20] *
                                    *(float *)((long)reduceGauss<unsigned_short,_unsigned_short>::g
                                              + lVar18);
                  lVar18 = lVar18 + 4;
                  lVar17 = lVar17 + 1;
                } while (lVar18 != 0x14);
              }
              else {
                puVar13 = puVar8 + lVar11 + -2;
                fVar21 = 0.0;
                lVar17 = 0;
                do {
                  uVar1 = *puVar13;
                  puVar13 = puVar13 + 1;
                  fVar21 = fVar21 + (float)uVar1 *
                                    *(float *)((long)reduceGauss<unsigned_short,_unsigned_short>::g
                                              + lVar17);
                  lVar17 = lVar17 + 4;
                } while (lVar17 != 0x14);
              }
              *pfVar12 = fVar21;
              pfVar12 = pfVar12 + 1;
              lVar11 = lVar11 + 2;
            } while (lVar11 < lVar5);
          }
          lVar10 = lVar10 + 1;
        } while (lVar10 != lVar6);
      }
      if (0 < local_68.width) {
        puVar8 = *pppuVar7[local_d8];
        lVar10 = target->width;
        lVar11 = 0;
        lVar17 = 0;
        do {
          if (0 < local_68.height) {
            puVar19 = puVar8 + lVar17;
            iVar9 = local_68.depth;
            if (0 < local_68.depth) {
              iVar9 = 1;
            }
            lVar18 = 0;
            do {
              if (lVar18 == 0 || local_68.height + -2 <= lVar18) {
                fVar21 = 0.0;
                lVar20 = 0;
                lVar14 = lVar18;
                do {
                  lVar15 = 2;
                  if (2 < lVar14) {
                    lVar15 = lVar14;
                  }
                  lVar16 = lVar15 + -2;
                  if (local_68.height + -1 <= lVar15 + -2) {
                    lVar16 = local_68.height + -1;
                  }
                  fVar21 = fVar21 + *(float *)((long)reduceGauss<unsigned_short,_unsigned_short>::g
                                              + lVar20) *
                                    local_68.img[(long)iVar9 + -1][lVar16][lVar17];
                  lVar20 = lVar20 + 4;
                  lVar14 = lVar14 + 1;
                } while (lVar20 != 0x14);
              }
              else {
                pfVar12 = (float *)((long)ppfVar3[lVar18 + -2] + lVar11);
                fVar21 = 0.0;
                lVar14 = 0;
                do {
                  fVar21 = fVar21 + *(float *)((long)reduceGauss<unsigned_short,_unsigned_short>::g
                                              + lVar14) * *pfVar12;
                  lVar14 = lVar14 + 4;
                  pfVar12 = pfVar12 + local_68.width;
                } while (lVar14 != 0x14);
              }
              *puVar19 = (unsigned_short)(int)fVar21;
              puVar19 = puVar19 + lVar10;
              lVar18 = lVar18 + 2;
            } while (lVar18 < local_68.height);
          }
          lVar17 = lVar17 + 1;
          lVar11 = lVar11 + 4;
        } while (lVar17 != local_68.width);
      }
      local_d8 = local_d8 + 1;
    } while (local_d8 != iVar2);
  }
  Image<float,_gimage::PixelTraits<float>_>::~Image(&local_68);
  return;
}

Assistant:

void reduceGauss(Image<T> &target, const Image<S> &image)
{
  static const float g[]={0.0625, 0.25, 0.375, 0.25, 0.0625};

  // intermediate image with downscaled width

  ImageFloat tmp((image.getWidth()+1)/2, image.getHeight(), 1);

  // downscaled target image

  target.setSize((image.getWidth()+1)/2, (image.getHeight()+1)/2, image.getDepth());

  // for all color channels

  for (int d=0; d<image.getDepth(); d++)
  {
    // convolve horizontal into horizontally downscaled intermediate image

    float *tmpp=tmp.getPtr(0, 0, 0);
    for (long k=0; k<image.getHeight(); k++)
    {
      for (long i=0; i<image.getWidth(); i+=2)
      {
        float pv=0;

        if (i >= 2 && i < image.getWidth()-2)
        {
          S *p=image.getPtr(i-2, k, d);
          for (long j=0; j<5; j++)
          {
            pv+=g[j]* *p++;
          }
        }
        else
        {
          for (long j=0; j<5; j++)
          {
            pv+=g[j]*image.getBounds(i+j-2, k, d);
          }
        }

        *tmpp++=pv;
      }
    }

    // convolve vertically into downscaled target image

    for (long i=0; i<tmp.getWidth(); i++)
    {
      T *tp=target.getPtr(i, 0, d);
      for (long k=0; k<tmp.getHeight(); k+=2)
      {
        float pv=0;

        if (k >= 2 && k < tmp.getHeight()-2)
        {
          float *p=tmp.getPtr(i, k-2, 0);
          for (long j=0; j<5; j++)
          {
            pv+=g[j]* *p;
            p+=tmp.getWidth();
          }
        }
        else
        {
          for (long j=0; j<5; j++)
          {
            pv+=g[j]*tmp.getBounds(i, k+j-2, 0);
          }
        }

        *tp=static_cast<T>(pv);
        tp+=target.getWidth();
      }
    }
  }
}